

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::update_tracker_timer(torrent *this,time_point32 now)

{
  _Atomic_word *p_Var1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  service_type *psVar6;
  array<state_t,_num_protocols,_protocol_version> *paVar7;
  undefined2 uVar8;
  bool bVar9;
  bool bVar10;
  undefined2 uVar11;
  pointer ptVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  node_ptr plVar17;
  ulong uVar18;
  pointer ptVar19;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar20;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  long lVar21;
  pointer ptVar22;
  pointer ptVar23;
  uint uVar24;
  undefined8 in_RDX;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer extraout_RDX_02;
  pointer extraout_RDX_03;
  pointer extraout_RDX_04;
  pointer extraout_RDX_05;
  pointer extraout_RDX_06;
  pointer extraout_RDX_07;
  pointer extraout_RDX_08;
  pointer extraout_RDX_09;
  pointer extraout_RDX_10;
  pointer ptVar25;
  undefined4 in_register_00000034;
  node_ptr this_00;
  undefined8 uVar26;
  long lVar27;
  ulong uVar28;
  pointer ptVar29;
  aux *paVar30;
  ulong uVar31;
  undefined1 local_e8 [8];
  wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d8;
  torrent *local_c8;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  int local_ac;
  uint local_9c;
  vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  listen_socket_states;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined8 local_70;
  node_ptr local_68;
  node_ptr local_60;
  _func_int **local_58;
  ulong local_50;
  ulong local_48;
  aux *local_40;
  node_ptr local_38;
  
  local_70 = CONCAT44(in_register_00000034,now.__d.__r);
  if ((this->field_0x5c0 & 0x40) == 0) {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    (*UNRECOVERED_JUMPTABLE)
              (this,"*** update tracker timer: not announcing",in_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  bVar13 = digest32<160L>::is_all_zeros(&(this->m_info_hash).v1);
  bVar14 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
  supports_protocol.super_array<const_bool,_2UL>._M_elems[1] = !bVar14;
  supports_protocol.super_array<const_bool,_2UL>._M_elems[0] = !bVar13;
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar15 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  ptVar22 = extraout_RDX;
  if ((char)iVar15 != '\0') {
    iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x2e])();
    local_e8 = (undefined1  [8])(CONCAT44(extraout_var,iVar15) + 0x438);
    local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)((ulong)local_e0 & 0xffffffffffffff00);
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e8);
    local_e0._0_1_ = true;
    uVar24 = *(uint *)(CONCAT44(extraout_var,iVar15) + 0x428);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e8);
    iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x2e])();
    local_e8 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar15) + 0x438);
    local_e0._0_1_ = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e8);
    local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)CONCAT71(local_e0._1_7_,1);
    uVar4 = *(uint *)(CONCAT44(extraout_var_00,iVar15) + 0x428);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e8);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,
               "*** update_tracker_timer: [ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
               ,(ulong)(uVar24 >> 0x11 & 1),(ulong)(uVar4 >> 0x12 & 1));
    ptVar22 = extraout_RDX_00;
  }
  plVar17 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node;
  local_9c = 0xffffffff;
  local_ac = 0x7fffffff;
  local_68 = plVar17;
  local_c8 = this;
  do {
    plVar17 = ((node *)&plVar17->next_)->next_;
    if (plVar17 == local_68) break;
    local_9c = local_9c + 1;
    this_00 = plVar17[5].next_;
    local_60 = plVar17[5].prev_;
    if (this_00 != plVar17[5].prev_) {
      do {
        ptVar12 = listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ptVar23 = listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar28 = (long)listen_socket_states.
                       super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)listen_socket_states.
                       super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        ptVar19 = listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (long)uVar28 >> 7) {
          ptVar22 = (pointer)this_00[0xc].next_;
          ptVar19 = (pointer)((long)&(((timer_state *)
                                      (&(listen_socket_states.
                                         super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->state + -1))->
                                     socket).m_sock.
                                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar28 & 0xffffffffffffff80));
          lVar21 = ((long)uVar28 >> 7) + 1;
          ptVar25 = listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if (ptVar22 ==
                (pointer)ptVar25[-2].socket.m_sock.
                         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi) {
              ptVar25 = ptVar25 + -2;
              goto LAB_00321e44;
            }
            if (ptVar22 ==
                (pointer)ptVar25[-1].socket.m_sock.
                         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi) {
              ptVar25 = ptVar25 + -1;
              goto LAB_00321e44;
            }
            if (ptVar22 ==
                (pointer)(ptVar25->socket).m_sock.
                         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi) goto LAB_00321e44;
            if (ptVar22 ==
                (pointer)ptVar25[1].socket.m_sock.
                         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi) {
              ptVar25 = ptVar25 + 1;
              goto LAB_00321e44;
            }
            lVar21 = lVar21 + -1;
            ptVar25 = ptVar25 + 4;
          } while (1 < lVar21);
        }
        lVar21 = (long)listen_socket_states.
                       super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar19 >> 5;
        if (lVar21 == 1) {
LAB_00321e20:
          ptVar25 = ptVar19;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[0xc].next_ !=
              (ptVar19->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi) {
            ptVar25 = listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        else if (lVar21 == 2) {
LAB_00321e0f:
          ptVar25 = ptVar19;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[0xc].next_ !=
              (ptVar19->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi) {
            ptVar19 = ptVar19 + 1;
            goto LAB_00321e20;
          }
        }
        else {
          ptVar25 = listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((lVar21 == 3) &&
             (ptVar25 = ptVar19,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[0xc].next_ !=
             (ptVar19->socket).m_sock.
             super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)) {
            ptVar19 = ptVar19 + 1;
            goto LAB_00321e0f;
          }
        }
LAB_00321e44:
        if (ptVar25 ==
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (listen_socket_states.
              super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              listen_socket_states.
              super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            if (uVar28 == 0x7fffffffffffffe0) {
              ::std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar28 = (long)uVar28 >> 5;
            uVar18 = uVar28;
            if (listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar18 = 1;
            }
            uVar31 = uVar18 + uVar28;
            if (0x3fffffffffffffe < uVar31) {
              uVar31 = 0x3ffffffffffffff;
            }
            if (CARRY8(uVar18,uVar28)) {
              uVar31 = 0x3ffffffffffffff;
            }
            if (uVar31 == 0) {
              ptVar19 = (pointer)0x0;
            }
            else {
              ptVar19 = (pointer)operator_new(uVar31 << 5);
              ptVar22 = extraout_RDX_02;
            }
            ::std::
            allocator_traits<std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>>::
            construct<libtorrent::aux::(anonymous_namespace)::timer_state,libtorrent::aux::listen_socket_handle_const&>
                      ((allocator_type *)(ptVar19 + uVar28),(timer_state *)&this_00[0xb].prev_,
                       &ptVar22->socket);
            ptVar22 = extraout_RDX_03;
            ptVar25 = ptVar19;
            for (ptVar29 = ptVar23; ptVar12 != ptVar29; ptVar29 = ptVar29 + 1) {
              (ptVar25->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (ptVar29->socket).m_sock.
                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
              (ptVar25->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (ptVar29->socket).m_sock.
                   super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              (ptVar29->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
              (ptVar29->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              bVar13 = (ptVar29->state).
                       super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                       ._M_elems[0].found_working;
              bVar14 = (ptVar29->state).
                       super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                       ._M_elems[0].done;
              uVar8 = *(undefined2 *)
                       &(ptVar29->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                        ._M_elems[0].field_0x6;
              iVar15 = (ptVar29->state).
                       super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                       ._M_elems[1].tier;
              paVar7 = &ptVar29->state;
              bVar9 = (paVar7->
                      super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                      )._M_elems[1].found_working;
              bVar10 = (paVar7->
                       super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                       )._M_elems[1].done;
              uVar11 = *(undefined2 *)
                        &(paVar7->
                         super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                         )._M_elems[1].field_0x6;
              (ptVar25->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[0].tier =
                   (ptVar29->state).
                   super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                   _M_elems[0].tier;
              (ptVar25->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[0].found_working = bVar13;
              (ptVar25->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[0].done = bVar14;
              *(undefined2 *)
               &(ptVar25->state).
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                _M_elems[0].field_0x6 = uVar8;
              (ptVar25->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[1].tier = iVar15;
              paVar7 = &ptVar25->state;
              (paVar7->
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>).
              _M_elems[1].found_working = bVar9;
              (paVar7->
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>).
              _M_elems[1].done = bVar10;
              *(undefined2 *)
               &(paVar7->
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>).
                _M_elems[1].field_0x6 = uVar11;
              p_Var5 = (ptVar29->socket).m_sock.
                       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var1 = &p_Var5->_M_weak_count;
                  iVar15 = *p_Var1;
                  *p_Var1 = *p_Var1 + -1;
                  UNLOCK();
                }
                else {
                  iVar15 = p_Var5->_M_weak_count;
                  p_Var5->_M_weak_count = iVar15 + -1;
                }
                if (iVar15 == 1) {
                  (*p_Var5->_vptr__Sp_counted_base[3])();
                  ptVar22 = extraout_RDX_04;
                }
              }
              ptVar25 = ptVar25 + 1;
            }
            if (ptVar23 != (pointer)0x0) {
              operator_delete(ptVar23,(long)listen_socket_states.
                                            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)ptVar23);
              ptVar22 = extraout_RDX_05;
            }
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_start = ptVar19;
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_finish = ptVar25 + 1;
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = ptVar19 + uVar31;
            this = local_c8;
          }
          else {
            ::std::
            allocator_traits<std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>>::
            construct<libtorrent::aux::(anonymous_namespace)::timer_state,libtorrent::aux::listen_socket_handle_const&>
                      ((allocator_type *)
                       listen_socket_states.
                       super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(timer_state *)&this_00[0xb].prev_
                       ,&ptVar22->socket);
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_finish = ptVar12 + 1;
            ptVar22 = extraout_RDX_01;
          }
          ptVar25 = listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
        }
        if (((ulong)this_00[0xb].next_ & 1) != 0) {
          local_38 = this_00 + 2;
          lVar21 = 0;
          do {
            uVar28 = (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar21];
            iVar15 = 9;
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems[uVar28] == true) &&
               ((ptVar25->state).
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                _M_elems[uVar28].done == false)) {
              iVar15 = (*(this->super_request_callback)._vptr_request_callback[6])();
              paVar30 = (aux *)((long)local_38 + uVar28 * 0x48);
              if ((char)iVar15 != '\0') {
                print_endpoint_abi_cxx11_((string *)local_e8,(aux *)this_00,(endpoint *)local_38);
                local_48 = (ulong)(byte)*(undefined1 *)((long)&plVar17[6].prev_ + 4);
                local_50 = (ulong)(uint)(ptVar25->state).
                                        super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                                        ._M_elems[uVar28].tier;
                uVar3 = *(ushort *)(paVar30 + 0x44);
                local_58 = (this->super_request_callback)._vptr_request_callback;
                local_40 = paVar30;
                (*local_58[7])(this,
                               "*** tracker: (%d) [ep: %s ] \"%s\" [ found: %d i->tier: %d tier: %d working: %d fails: %d limit: %d upd: %d ]"
                               ,(ulong)local_9c,local_e8,plVar17[1].next_,
                               (ulong)(ptVar25->state).
                                      super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                                      ._M_elems[uVar28].found_working,local_48,local_50,
                               (ulong)((uVar3 & 0x7f) == 0),(ulong)(uVar3 & 0x7f),
                               (ulong)(byte)*(undefined1 *)((long)&plVar17[6].prev_ + 5),
                               (ulong)(uVar3 >> 7 & 1));
                paVar30 = local_40;
                this = local_c8;
                if (local_e8 != (undefined1  [8])&aStack_d8) {
                  operator_delete((void *)local_e8,aStack_d8._M_allocated_capacity + 1);
                  paVar30 = local_40;
                  this = local_c8;
                }
              }
              iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[0x2e])();
              local_e8 = (undefined1  [8])(CONCAT44(extraout_var_01,iVar15) + 0x438);
              local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          *)((ulong)local_e0 & 0xffffffffffffff00);
              ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e8);
              local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          *)CONCAT71(local_e0._1_7_,1);
              uVar24 = *(uint *)(CONCAT44(extraout_var_01,iVar15) + 0x428);
              ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e8);
              ptVar22 = extraout_RDX_06;
              iVar15 = 9;
              if ((uVar24 >> 0x11 & 1) != 0) {
                iVar16 = (*(((local_c8->super_torrent_hot_members).m_ses)->super_session_logger).
                           _vptr_session_logger[0x2e])();
                local_e8 = (undefined1  [8])(CONCAT44(extraout_var_02,iVar16) + 0x438);
                local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)((ulong)local_e0 & 0xffffffffffffff00);
                ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e8);
                local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)CONCAT71(local_e0._1_7_,1);
                uVar24 = *(uint *)(CONCAT44(extraout_var_02,iVar16) + 0x428);
                ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e8);
                ptVar22 = extraout_RDX_07;
                if ((((uVar24 >> 0x12 & 1) == 0) &&
                    ((ptVar25->state).
                     super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                     _M_elems[uVar28].found_working == true)) &&
                   (iVar16 = (ptVar25->state).
                             super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                             ._M_elems[uVar28].tier, this = local_c8,
                   (int)(uint)(byte)*(undefined1 *)((long)&plVar17[6].prev_ + 4) <= iVar16 &&
                   iVar16 != 0x7fffffff)) goto LAB_00322308;
              }
              if ((ptVar25->state).
                  super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                  _M_elems[uVar28].tier <
                  (int)(uint)(byte)*(undefined1 *)((long)&plVar17[6].prev_ + 4)) {
                iVar16 = (*(((local_c8->super_torrent_hot_members).m_ses)->super_session_logger).
                           _vptr_session_logger[0x2e])();
                local_e8 = (undefined1  [8])(CONCAT44(extraout_var_03,iVar16) + 0x438);
                local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)((ulong)local_e0 & 0xffffffffffffff00);
                ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e8);
                local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)CONCAT71(local_e0._1_7_,1);
                uVar24 = *(uint *)(CONCAT44(extraout_var_03,iVar16) + 0x428);
                ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e8);
                ptVar22 = extraout_RDX_08;
                if ((uVar24 >> 0x11 & 1) == 0) {
                  this = local_c8;
                  iVar15 = 8;
                  goto LAB_00322308;
                }
                (ptVar25->state).
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                _M_elems[uVar28].found_working = false;
              }
              (ptVar25->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[uVar28].tier = (uint)(byte)*(undefined1 *)((long)&plVar17[6].prev_ + 4);
              bVar2 = *(undefined1 *)((long)&plVar17[6].prev_ + 5);
              this = local_c8;
              if ((bVar2 == 0) ||
                 (uVar24 = *(ushort *)(paVar30 + 0x44) & 0x7f, ptVar22 = (pointer)(ulong)uVar24,
                 (ushort)uVar24 < (ushort)bVar2)) {
                if ((char)*(ushort *)(paVar30 + 0x44) < '\0') {
                  (ptVar25->state).
                  super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                  _M_elems[uVar28].found_working = true;
                }
                else {
                  iVar15 = *(int *)(paVar30 + 0x34);
                  if (*(int *)(paVar30 + 0x34) < *(int *)(paVar30 + 0x30)) {
                    iVar15 = *(int *)(paVar30 + 0x30);
                  }
                  if (iVar15 < local_ac) {
                    local_ac = iVar15;
                  }
                }
                if (((byte)paVar30[0x44] & 0x7f) == 0) {
                  (ptVar25->state).
                  super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                  _M_elems[uVar28].found_working = true;
                }
                iVar15 = 0;
                if ((ptVar25->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                    _M_elems[uVar28].found_working == true) {
                  iVar16 = (*(((local_c8->super_torrent_hot_members).m_ses)->super_session_logger).
                             _vptr_session_logger[0x2e])();
                  local_e8 = (undefined1  [8])(CONCAT44(extraout_var_04,iVar16) + 0x438);
                  local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                              *)((ulong)local_e0 & 0xffffffffffffff00);
                  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e8);
                  local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                              *)CONCAT71(local_e0._1_7_,1);
                  uVar24 = *(uint *)(CONCAT44(extraout_var_04,iVar16) + 0x428);
                  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e8);
                  ptVar22 = extraout_RDX_09;
                  this = local_c8;
                  if ((uVar24 >> 0x12 & 1) == 0) {
                    iVar16 = (*(((local_c8->super_torrent_hot_members).m_ses)->super_session_logger)
                               ._vptr_session_logger[0x2e])();
                    local_e8 = (undefined1  [8])(CONCAT44(extraout_var_05,iVar16) + 0x438);
                    local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                                *)((ulong)local_e0 & 0xffffffffffffff00);
                    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e8);
                    local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                                *)CONCAT71(local_e0._1_7_,1);
                    uVar24 = *(uint *)(CONCAT44(extraout_var_05,iVar16) + 0x428);
                    ::std::unique_lock<std::mutex>::~unique_lock
                              ((unique_lock<std::mutex> *)local_e8);
                    ptVar22 = extraout_RDX_10;
                    this = local_c8;
                    if ((uVar24 >> 0x11 & 1) == 0) {
                      (ptVar25->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                      ._M_elems[uVar28].done = true;
                      iVar15 = 0;
                    }
                  }
                }
              }
            }
LAB_00322308:
          } while (((iVar15 == 9) || (iVar15 == 0)) && (lVar21 = lVar21 + 1, lVar21 != 2));
        }
        this_00 = (node_ptr)&this_00[0xc].prev_;
      } while (this_00 != local_60);
    }
    local_e8._0_2_ = supports_protocol.super_array<const_bool,_2UL>._M_elems;
    lVar21 = (long)listen_socket_states.
                   super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)listen_socket_states.
                   super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 7;
    ptVar23 = listen_socket_states.
              super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < lVar21) {
      ptVar23 = (pointer)((long)&(((timer_state *)
                                  (&(listen_socket_states.
                                     super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->state + -1))->
                                 socket).m_sock.
                                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr +
                         ((long)listen_socket_states.
                                super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)listen_socket_states.
                                super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff80U));
      ptVar22 = listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar13 = false;
        lVar27 = 0;
        do {
          if ((local_e8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar27]] == '\x01')
             && ((ptVar22->state).
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar27]].done !=
                 true)) break;
          lVar27 = lVar27 + 1;
          bVar13 = lVar27 == 2;
        } while (!bVar13);
        if (!bVar13) goto LAB_00322501;
        bVar13 = false;
        lVar27 = 0;
        do {
          if ((local_e8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar27]] == '\x01')
             && (ptVar22[1].state.
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar27]].done !=
                 true)) break;
          lVar27 = lVar27 + 1;
          bVar13 = lVar27 == 2;
        } while (!bVar13);
        if (!bVar13) {
          ptVar22 = ptVar22 + 1;
          goto LAB_00322501;
        }
        bVar13 = false;
        lVar27 = 0;
        do {
          if ((local_e8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar27]] == '\x01')
             && (ptVar22[2].state.
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar27]].done !=
                 true)) break;
          lVar27 = lVar27 + 1;
          bVar13 = lVar27 == 2;
        } while (!bVar13);
        if (!bVar13) {
          ptVar22 = ptVar22 + 2;
          goto LAB_00322501;
        }
        bVar13 = false;
        lVar27 = 0;
        do {
          if ((local_e8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar27]] == '\x01')
             && (ptVar22[3].state.
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar27]].done !=
                 true)) break;
          lVar27 = lVar27 + 1;
          bVar13 = lVar27 == 2;
        } while (!bVar13);
        if (!bVar13) {
          ptVar22 = ptVar22 + 3;
          goto LAB_00322501;
        }
        ptVar22 = ptVar22 + 4;
        bVar13 = 1 < lVar21;
        lVar21 = lVar21 + -1;
      } while (bVar13);
    }
    lVar21 = (long)listen_socket_states.
                   super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar23 >> 5;
    if (lVar21 == 1) {
LAB_003224c1:
      bVar13 = false;
      lVar21 = 0;
      do {
        if ((local_e8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar21]] == '\x01')
           && ((ptVar23->state).
               super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
               _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar21]].done !=
               true)) break;
        lVar21 = lVar21 + 1;
        bVar13 = lVar21 == 2;
      } while (!bVar13);
      ptVar22 = ptVar23;
      if (bVar13) {
        ptVar22 = listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (lVar21 == 2) {
LAB_00322494:
      bVar13 = false;
      lVar21 = 0;
      do {
        if ((local_e8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar21]] == '\x01')
           && ((ptVar23->state).
               super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
               _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar21]].done !=
               true)) break;
        lVar21 = lVar21 + 1;
        bVar13 = lVar21 == 2;
      } while (!bVar13);
      ptVar22 = ptVar23;
      if (bVar13) {
        ptVar23 = ptVar23 + 1;
        goto LAB_003224c1;
      }
    }
    else {
      ptVar22 = listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (lVar21 == 3) {
        bVar13 = false;
        lVar21 = 0;
        do {
          if ((local_e8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar21]] == '\x01')
             && ((ptVar23->state).
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar21]].done !=
                 true)) break;
          lVar21 = lVar21 + 1;
          bVar13 = lVar21 == 2;
        } while (!bVar13);
        ptVar22 = ptVar23;
        if (bVar13) {
          ptVar23 = ptVar23 + 1;
          goto LAB_00322494;
        }
      }
    }
LAB_00322501:
  } while (ptVar22 !=
           listen_socket_states.
           super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  iVar15 = (int)local_70;
  iVar16 = iVar15 + 0x3c;
  if (local_ac != 0x7fffffff) {
    iVar16 = local_ac;
  }
  if (local_ac <= iVar15) {
    iVar16 = iVar15;
  }
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,
             "*** update tracker timer: before_now: %d none_eligible: %d m_waiting_tracker: %d next_announce_in: %d"
             ,(ulong)(local_ac <= iVar15),(ulong)(iVar15 < local_ac && local_ac == 0x7fffffff),
             (ulong)(uint)(int)this->m_waiting_tracker,(ulong)(uint)(iVar16 - iVar15));
  if ((this->m_waiting_tracker == '\0') ||
     ((this->m_tracker_timer).impl_.implementation_.expiry.__d.__r != (long)iVar16 * 1000000000)) {
    if ((this->m_tracker_timer).impl_.implementation_.might_have_pending_waits == true) {
      psVar6 = (this->m_tracker_timer).impl_.service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar6->scheduler_,&psVar6->timer_queue_,
                 &(this->m_tracker_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
      (this->m_tracker_timer).impl_.implementation_.might_have_pending_waits = false;
    }
    (this->m_tracker_timer).impl_.implementation_.expiry.__d.__r = (long)iVar16 * 1000000000;
    this->m_waiting_tracker = this->m_waiting_tracker + '\x01';
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)
               local_80._M_local_buf,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    psVar6 = (this->m_tracker_timer).impl_.service_;
    local_e8 = (undefined1  [8])&local_80;
    plVar20 = (long *)__tls_get_addr(&PTR_004faf08);
    if (*plVar20 == 0) {
      uVar26 = 0;
    }
    else {
      uVar26 = *(undefined8 *)(*plVar20 + 8);
    }
    op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          *)boost::asio::detail::thread_info_base::
            allocate<boost::asio::detail::thread_info_base::default_tag>(uVar26,0x68);
    uVar26 = local_80._8_8_;
    aStack_d8._M_allocated_capacity = 0;
    (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
    (op->super_wait_op).super_operation.func_ =
         boost::asio::detail::
         wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
         ::do_complete;
    (op->super_wait_op).super_operation.task_result_ = 0;
    (op->super_wait_op).ec_.val_ = 0;
    (op->super_wait_op).ec_.failed_ = false;
    (op->super_wait_op).ec_.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    (op->handler_).self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_80._M_allocated_capacity;
    (op->handler_).self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (op->handler_).self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar26;
    local_80._M_allocated_capacity = 0;
    local_e0 = op;
    boost::asio::detail::
    handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
    ::handler_work_base(&(op->work_).
                         super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                        ,&(this->m_tracker_timer).impl_.executor_);
    (this->m_tracker_timer).impl_.implementation_.might_have_pending_waits = true;
    aStack_d8._M_allocated_capacity = (size_type)op;
    boost::asio::detail::epoll_reactor::
    schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
              (psVar6->scheduler_,&psVar6->timer_queue_,
               &(this->m_tracker_timer).impl_.implementation_.expiry,
               &(this->m_tracker_timer).impl_.implementation_.timer_data,(wait_op *)op);
    local_e0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
    aStack_d8._M_allocated_capacity = 0;
    boost::asio::detail::
    wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::ptr::reset((ptr *)local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    }
  }
  ::std::
  vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ::~vector(&listen_socket_states);
  return;
}

Assistant:

void torrent::update_tracker_timer(time_point32 const now)
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_announcing)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** update tracker timer: not announcing");
#endif
			return;
		}

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol{
		{
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		}};
#ifdef __clang__
#pragma clang diagnostic pop
#endif

		time_point32 next_announce = time_point32::max();

		std::vector<timer_state> listen_socket_states;

#ifndef TORRENT_DISABLE_LOGGING
		int idx = -1;
		if (should_log())
		{
			debug_log("*** update_tracker_timer: "
				"[ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
				, settings().get_bool(settings_pack::announce_to_all_tiers)
				, settings().get_bool(settings_pack::announce_to_all_trackers)
				, int(m_trackers.size()));
		}
#endif
		for (auto const& t : m_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			++idx;
#endif
			for (auto const& aep : t.endpoints)
			{
				auto aep_state_iter = std::find_if(listen_socket_states.begin(), listen_socket_states.end()
					, [&](timer_state const& s) { return s.socket == aep.socket; });
				if (aep_state_iter == listen_socket_states.end())
				{
					listen_socket_states.emplace_back(aep.socket);
					aep_state_iter = listen_socket_states.end() - 1;
				}
				timer_state& ep_state = *aep_state_iter;

				if (!aep.enabled) continue;
				for (protocol_version const ih : all_versions)
				{
					if (!supports_protocol[ih]) continue;

					auto& state = ep_state.state[ih];
					auto const& a = aep.info_hashes[ih];

					if (state.done) continue;

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("*** tracker: (%d) [ep: %s ] \"%s\" ["
							" found: %d i->tier: %d tier: %d"
							" working: %d fails: %d limit: %d upd: %d ]"
							, idx, print_endpoint(aep.local_endpoint).c_str(), t.url.c_str()
							, state.found_working, t.tier, state.tier, a.is_working()
							, a.fails, t.fail_limit, a.updating);
					}
#endif

					if (settings().get_bool(settings_pack::announce_to_all_tiers)
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& state.found_working
						&& t.tier <= state.tier
						&& state.tier != INT_MAX)
						continue;

					if (t.tier > state.tier)
					{
						if (!settings().get_bool(settings_pack::announce_to_all_tiers)) break;
						state.found_working = false;
					}
					state.tier = t.tier;
					if (a.fails >= t.fail_limit && t.fail_limit != 0) continue;
					if (a.updating)
					{
						state.found_working = true;
					}
					else
					{
						time_point32 const next_tracker_announce = std::max(a.next_announce, a.min_announce);
						if (next_tracker_announce < next_announce)
							next_announce = next_tracker_announce;
					}
					if (a.is_working()) state.found_working = true;
					if (state.found_working
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& !settings().get_bool(settings_pack::announce_to_all_tiers))
						state.done = true;
				}
			}

			if (std::all_of(listen_socket_states.begin(), listen_socket_states.end()
				, [supports_protocol](timer_state const& s) {
					for (protocol_version const ih : all_versions)
					{
						if (supports_protocol[ih] && !s.state[ih].done)
							return false;
					}
					return true;
				}))
				break;
		}

#ifndef TORRENT_DISABLE_LOGGING
		bool before_now = false;
		bool none_eligible = false;
#endif
		if (next_announce <= now)
		{
			next_announce = now;
#ifndef TORRENT_DISABLE_LOGGING
			before_now = true;
#endif
		}
		else if (next_announce == time_point32::max())
		{
			// if no tracker can be announced to, check again in a minute
			next_announce = now + minutes32(1);
#ifndef TORRENT_DISABLE_LOGGING
			none_eligible = true;
#endif
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("*** update tracker timer: "
			"before_now: %d "
			"none_eligible: %d "
			"m_waiting_tracker: %d "
			"next_announce_in: %d"
			, before_now
			, none_eligible
			, m_waiting_tracker
			, int(total_seconds(next_announce - now)));
#endif

		// don't re-issue the timer if it's the same expiration time as last time
		// if m_waiting_tracker is 0, expires_at() is undefined
		if (m_waiting_tracker && m_tracker_timer.expiry() == next_announce) return;

		m_tracker_timer.expires_at(next_announce);
		ADD_OUTSTANDING_ASYNC("tracker::on_tracker_announce");
		++m_waiting_tracker;
		m_tracker_timer.async_wait([self = shared_from_this()](error_code const& e)
			{ self->wrap(&torrent::on_tracker_announce, e); });
	}